

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O2

ssize_t __thiscall FileWriter::write(FileWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ostream *poVar2;
  FileWriter *pFVar3;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  string path;
  ofstream of;
  
  buildPath(&path,this,(string *)CONCAT44(in_register_00000034,__fd));
  bVar1 = tryWrite(this,&path);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Writing: ");
    std::operator<<(poVar2,(string *)&path);
    std::ofstream::ofstream(&of,(string *)&path,_S_out);
    pFVar3 = (FileWriter *)&of;
    std::ostream::write((char *)pFVar3,*__buf);
    logTime(pFVar3,(Timer *)__n);
    std::ofstream::~ofstream(&of);
  }
  else {
    pFVar3 = (FileWriter *)std::operator<<((ostream *)&std::cout,"Skipping (file exists): ");
    std::operator<<((ostream *)pFVar3,(string *)&path);
    logTime(pFVar3,(Timer *)__n);
  }
  sVar4 = std::__cxx11::string::~string((string *)&path);
  return sVar4;
}

Assistant:

void FileWriter::write(
  const std::string& tail,
  const std::vector<char>& data,
  const Timer* t) {
  auto path = buildPath(tail);
  if (!tryWrite(path)) {
    std::cout << "Skipping (file exists): " << path;
    logTime(t);
    return;
  }

  std::cout << "Writing: " << path;
  std::ofstream of(path);
  of.write(data.data(), data.size());
  logTime(t);
}